

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf.cpp
# Opt level: O3

bool SignalsOptInRBF(CTransaction *tx)

{
  pointer pCVar1;
  pointer pCVar2;
  pointer pCVar3;
  long in_FS_OFFSET;
  bool bVar4;
  
  pCVar1 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar1 == pCVar2) {
    bVar4 = false;
  }
  else {
    do {
      pCVar3 = pCVar1 + 1;
      bVar4 = pCVar1->nSequence < 0xfffffffe;
      if (bVar4) break;
      pCVar1 = pCVar3;
    } while (pCVar3 != pCVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool SignalsOptInRBF(const CTransaction &tx)
{
    for (const CTxIn &txin : tx.vin) {
        if (txin.nSequence <= MAX_BIP125_RBF_SEQUENCE) {
            return true;
        }
    }
    return false;
}